

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

base_learner * ftrl_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  element_type *peVar2;
  undefined8 uVar3;
  int iVar4;
  option_group_definition *poVar5;
  ostream *poVar6;
  typed_option<unsigned_long> *ptVar7;
  element_type eVar8;
  learner<ftrl,_example> *plVar9;
  uint32_t *puVar10;
  code *predict;
  code *pcVar11;
  float fVar12;
  bool coin;
  bool pistol;
  bool ftrl_option;
  free_ptr<ftrl> b;
  allocator local_4da;
  allocator local_4d9;
  allocator local_4d8;
  allocator local_4d7;
  allocator local_4d6;
  allocator local_4d5;
  allocator local_4d4;
  allocator local_4d3;
  allocator local_4d2;
  allocator local_4d1;
  string algorithm_name;
  string local_4a0 [64];
  bool local_460;
  string local_430 [32];
  string local_410;
  string local_3f0 [32];
  string local_3d0;
  string local_3b0 [32];
  string local_390;
  string local_370 [32];
  string local_350;
  string local_330 [32];
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [112];
  bool local_260;
  option_group_definition new_options;
  undefined1 local_1f8 [112];
  bool local_188;
  undefined1 local_158 [160];
  undefined1 local_b8 [160];
  
  scoped_calloc_or_throw<ftrl>();
  ftrl_option = false;
  pistol = false;
  coin = false;
  std::__cxx11::string::string
            ((string *)&local_2f0,"Follow the Regularized Leader",(allocator *)&algorithm_name);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string((string *)&local_310,"ftrl",&local_4d1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&algorithm_name,&local_310,&ftrl_option);
  local_460 = true;
  std::__cxx11::string::string(local_330,"FTRL: Follow the Proximal Regularized Leader",&local_4d2);
  std::__cxx11::string::_M_assign(local_4a0);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)&algorithm_name);
  std::__cxx11::string::string((string *)&local_350,"coin",&local_4d3);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_2d0,&local_350,&coin);
  local_260 = true;
  std::__cxx11::string::string(local_370,"Coin betting optimizer",&local_4d4);
  std::__cxx11::string::_M_assign((string *)(local_2d0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_2d0);
  std::__cxx11::string::string((string *)&local_390,"pistol",&local_4d5);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_1f8,&local_390,&pistol);
  local_188 = true;
  std::__cxx11::string::string(local_3b0,"PiSTOL: Parameter-free STOchastic Learning",&local_4d6);
  std::__cxx11::string::_M_assign((string *)(local_1f8 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_1f8);
  std::__cxx11::string::string((string *)&local_3d0,"ftrl_alpha",&local_4d7);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_b8,&local_3d0,
             &(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_alpha);
  std::__cxx11::string::string(local_3f0,"Learning rate for FTRL optimization",&local_4d8);
  std::__cxx11::string::_M_assign((string *)(local_b8 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar5,(typed_option<float> *)local_b8);
  std::__cxx11::string::string((string *)&local_410,"ftrl_beta",&local_4d9);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_158,&local_410,
             &(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_beta);
  std::__cxx11::string::string(local_430,"Learning rate for FTRL optimization",&local_4da);
  std::__cxx11::string::_M_assign((string *)(local_158 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (poVar5,(typed_option<float> *)local_158);
  std::__cxx11::string::~string(local_430);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_158);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string(local_3f0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_b8);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string(local_3b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1f8);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string(local_370);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2d0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string(local_330);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&algorithm_name);
  std::__cxx11::string::~string((string *)&local_310);
  (**options->_vptr_options_i)(options,&new_options);
  if (ftrl_option == false) {
    if (pistol != false) {
      std::__cxx11::string::string((string *)&algorithm_name,"ftrl_alpha",(allocator *)local_2d0);
      iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
      if ((char)iVar4 == '\0') {
        fVar12 = 1.0;
      }
      else {
        fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
      }
      (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl)->ftrl_alpha = fVar12;
      std::__cxx11::string::~string((string *)&algorithm_name);
      std::__cxx11::string::string((string *)&algorithm_name,"ftrl_beta",(allocator *)local_2d0);
      iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
      if ((char)iVar4 != '\0') goto LAB_001c5e48;
      fVar12 = 0.5;
      goto LAB_001c5e57;
    }
    if (coin == false) {
      plVar9 = (learner<ftrl,_example> *)0x0;
      goto LAB_001c6152;
    }
    if (coin == true) {
      std::__cxx11::string::string((string *)&algorithm_name,"ftrl_alpha",(allocator *)local_2d0);
      iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
      if ((char)iVar4 == '\0') {
        fVar12 = 4.0;
      }
      else {
        fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
      }
      (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl)->ftrl_alpha = fVar12;
      std::__cxx11::string::~string((string *)&algorithm_name);
      std::__cxx11::string::string((string *)&algorithm_name,"ftrl_beta",(allocator *)local_2d0);
      iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
      if ((char)iVar4 != '\0') goto LAB_001c5e48;
      fVar12 = 1.0;
      goto LAB_001c5e57;
    }
  }
  else {
    std::__cxx11::string::string((string *)&algorithm_name,"ftrl_alpha",(allocator *)local_2d0);
    iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
    if ((char)iVar4 == '\0') {
      fVar12 = 0.005;
    }
    else {
      fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar12;
    std::__cxx11::string::~string((string *)&algorithm_name);
    std::__cxx11::string::string((string *)&algorithm_name,"ftrl_beta",(allocator *)local_2d0);
    iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
    if ((char)iVar4 == '\0') {
      fVar12 = 0.1;
    }
    else {
LAB_001c5e48:
      fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta;
    }
LAB_001c5e57:
    (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_beta = fVar12;
    std::__cxx11::string::~string((string *)&algorithm_name);
  }
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all = all;
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all->normalized_sum_norm_x = 0.0;
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  algorithm_name._M_dataplus._M_p = (pointer)&algorithm_name.field_2;
  algorithm_name._M_string_length = 0;
  algorithm_name.field_2._M_local_buf[0] = '\0';
  if (ftrl_option == true) {
    std::__cxx11::string::assign((char *)&algorithm_name);
    pcVar11 = learn_proximal<false>;
    if (all->audit != false) {
      pcVar11 = learn_proximal<true>;
    }
    parameters::stride_shift(&all->weights,2);
  }
  else if (pistol == true) {
    std::__cxx11::string::assign((char *)&algorithm_name);
    parameters::stride_shift(&all->weights,2);
    pcVar11 = learn_pistol;
  }
  else if (coin == true) {
    std::__cxx11::string::assign((char *)&algorithm_name);
    parameters::stride_shift(&all->weights,3);
    pcVar11 = learn_cb;
  }
  else {
    pcVar11 = (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)0x0;
  }
  fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->ftrl_beta;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_alpha =
       (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
       _M_head_impl)->ftrl_alpha;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_beta = fVar12;
  pvVar1 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->all;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l1_lambda = pvVar1->l1_lambda;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l2_lambda = pvVar1->l2_lambda;
  if (all->quiet == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Enabling FTRL based optimization");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Algorithm used: ");
    poVar6 = std::operator<<(poVar6,(string *)&algorithm_name);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_alpha = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_beta = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::__cxx11::string::string((string *)local_2d0,"early_terminate",(allocator *)local_1f8);
    ptVar7 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)local_2d0);
    peVar2 = (ptVar7->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      eVar8 = 0;
    }
    else {
      eVar8 = *peVar2;
    }
    (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->early_stop_thres = eVar8;
    std::__cxx11::string::~string((string *)local_2d0);
  }
  predict = predict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar10 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar10 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar9 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                     (&b,pcVar11,predict,1L << ((byte)*puVar10 & 0x3f));
  uVar3 = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0x48) = uVar3;
  *(code **)(plVar9 + 0x50) = sensitivity;
  pcVar11 = multipredict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    pcVar11 = multipredict<true>;
  }
  *(code **)(plVar9 + 0x40) = pcVar11;
  *(code **)(plVar9 + 0x80) = save_load;
  *(undefined8 *)(plVar9 + 0x70) = uVar3;
  *(undefined8 *)(plVar9 + 0x78) = *(undefined8 *)(plVar9 + 0x20);
  *(undefined8 *)(plVar9 + 0x88) = uVar3;
  *(undefined8 *)(plVar9 + 0x90) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 0x98) = end_pass;
  std::__cxx11::string::~string((string *)&algorithm_name);
LAB_001c6152:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::~unique_ptr(&b);
  return (base_learner *)plVar9;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;
  bool coin = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("coin", coin).keep().help("Coin betting optimizer"))
      .add(make_option("pistol", pistol).keep().help("PiSTOL: Parameter-free STOchastic Learning"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol && !coin)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }
  else if (coin)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 4.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 1.0f;
  }


  b->all = &all;
  b->no_win_counter = 0;
  b->all->normalized_sum_norm_x = 0;
  b->total_weight = 0.;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
      all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
    all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (coin)
  {
    algorithm_name = "Coin Betting";
    learn_ptr = learn_cb;
    all.weights.stride_shift(3);  // NOTE: for more parameter storage
  }

  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}